

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O0

int luaB_loadfile(lua_State *L)

{
  int iVar1;
  int envidx;
  char *filename;
  char *mode_00;
  int status;
  int env;
  char *mode;
  char *fname;
  lua_State *L_local;
  
  filename = luaL_optlstring(L,1,(char *)0x0,(size_t *)0x0);
  mode_00 = luaL_optlstring(L,2,(char *)0x0,(size_t *)0x0);
  iVar1 = lua_type(L,3);
  envidx = 0;
  if (iVar1 != -1) {
    envidx = 3;
  }
  iVar1 = luaL_loadfilex(L,filename,mode_00);
  iVar1 = load_aux(L,iVar1,envidx);
  return iVar1;
}

Assistant:

static int luaB_loadfile (lua_State *L) {
  const char *fname = luaL_optstring(L, 1, NULL);
  const char *mode = luaL_optstring(L, 2, NULL);
  int env = (!lua_isnone(L, 3) ? 3 : 0);  /* 'env' index or 0 if no 'env' */
  int status = luaL_loadfilex(L, fname, mode);
  return load_aux(L, status, env);
}